

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

ObjList * new_list(Vm *vm,size_t size)

{
  void *pvVar1;
  undefined1 local_38 [8];
  ValueArray val_arr;
  ObjList *list;
  size_t size_local;
  Vm *vm_local;
  
  val_arr.values = (CrispyValue *)allocate_object(vm,0x28,OBJ_LIST);
  val_arr_init((ValueArray *)local_38);
  val_arr.cap = size & 0xffffffff;
  local_38 = (undefined1  [8])next_pow_of_2(val_arr.cap);
  pvVar1 = reallocate((void *)val_arr.count,(long)local_38 << 4);
  *(undefined1 (*) [8])(val_arr.values + 1) = local_38;
  val_arr.values[1].field_1.p_value = val_arr.cap;
  *(void **)(val_arr.values + 2) = pvVar1;
  return (ObjList *)val_arr.values;
}

Assistant:

ObjList *new_list(Vm *vm, size_t size) {
    ObjList *list = ALLOC_OBJ(vm, ObjList, OBJ_LIST);
    ValueArray val_arr;
    val_arr_init(&val_arr);

    val_arr.count = (uint32_t) size;
    val_arr.cap = next_pow_of_2(val_arr.count);
    val_arr.values = GROW_ARR(val_arr.values, CrispyValue, val_arr.cap);

    list->content = val_arr;

    return list;
}